

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::MergeMaterials
               (aiMaterial **dest,const_iterator begin,const_iterator end)

{
  undefined1 auVar1 [16];
  uint uVar2;
  bool bVar3;
  aiReturn aVar4;
  aiMaterial *this;
  ulong uVar5;
  aiMaterialProperty **ppaVar6;
  reference ppaVar7;
  char *pcVar8;
  aiMaterialProperty *this_00;
  aiMaterialProperty *prop;
  aiMaterialProperty *prop_exist;
  aiMaterialProperty *sprop;
  __normal_iterator<aiMaterial_*const_*,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
  _Stack_48;
  uint i;
  const_iterator it_1;
  const_iterator it;
  uint size;
  aiMaterial *out;
  aiMaterial **dest_local;
  const_iterator end_local;
  const_iterator begin_local;
  
  if (dest != (aiMaterial **)0x0) {
    dest_local = end._M_current;
    end_local = begin;
    bVar3 = __gnu_cxx::operator==
                      (&end_local,
                       (__normal_iterator<aiMaterial_*const_*,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                        *)&dest_local);
    if (bVar3) {
      *dest = (aiMaterial *)0x0;
    }
    else {
      this = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this);
      *dest = this;
      it._M_current._0_4_ = 0;
      it_1 = end_local;
      while (bVar3 = __gnu_cxx::operator!=
                               (&it_1,(__normal_iterator<aiMaterial_*const_*,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                                       *)&dest_local), bVar3) {
        ppaVar7 = __gnu_cxx::
                  __normal_iterator<aiMaterial_*const_*,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                  ::operator*(&it_1);
        it._M_current._0_4_ = (*ppaVar7)->mNumProperties + (uint)it._M_current;
        __gnu_cxx::
        __normal_iterator<aiMaterial_*const_*,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
        ::operator++(&it_1);
      }
      aiMaterial::Clear(this);
      if (this->mProperties != (aiMaterialProperty **)0x0) {
        operator_delete__(this->mProperties);
      }
      this->mNumAllocated = (uint)it._M_current;
      this->mNumProperties = 0;
      auVar1 = ZEXT416(this->mNumAllocated) * ZEXT816(8);
      uVar5 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      ppaVar6 = (aiMaterialProperty **)operator_new__(uVar5);
      this->mProperties = ppaVar6;
      _Stack_48._M_current = end_local._M_current;
      while (bVar3 = __gnu_cxx::operator!=
                               (&stack0xffffffffffffffb8,
                                (__normal_iterator<aiMaterial_*const_*,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                                 *)&dest_local), bVar3) {
        for (sprop._4_4_ = 0; uVar2 = sprop._4_4_,
            ppaVar7 = __gnu_cxx::
                      __normal_iterator<aiMaterial_*const_*,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                      ::operator*(&stack0xffffffffffffffb8), uVar2 < (*ppaVar7)->mNumProperties;
            sprop._4_4_ = sprop._4_4_ + 1) {
          ppaVar7 = __gnu_cxx::
                    __normal_iterator<aiMaterial_*const_*,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
                    ::operator*(&stack0xffffffffffffffb8);
          prop_exist = (*ppaVar7)->mProperties[sprop._4_4_];
          pcVar8 = aiString::C_Str(&prop_exist->mKey);
          aVar4 = aiGetMaterialProperty(this,pcVar8,prop_exist->mSemantic,prop_exist->mIndex,&prop);
          if (aVar4 != aiReturn_SUCCESS) {
            this_00 = (aiMaterialProperty *)operator_new(0x420);
            aiMaterialProperty::aiMaterialProperty(this_00);
            this->mProperties[this->mNumProperties] = this_00;
            this_00->mDataLength = prop_exist->mDataLength;
            pcVar8 = (char *)operator_new__((ulong)this_00->mDataLength);
            this_00->mData = pcVar8;
            memcpy(this_00->mData,prop_exist->mData,(ulong)this_00->mDataLength);
            this_00->mIndex = prop_exist->mIndex;
            this_00->mSemantic = prop_exist->mSemantic;
            aiString::operator=((aiString *)this_00,&prop_exist->mKey);
            this_00->mType = prop_exist->mType;
            this->mNumProperties = this->mNumProperties + 1;
          }
        }
        __gnu_cxx::
        __normal_iterator<aiMaterial_*const_*,_std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>_>
        ::operator++(&stack0xffffffffffffffb8);
      }
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeMaterials(aiMaterial** dest,
        std::vector<aiMaterial*>::const_iterator begin,
        std::vector<aiMaterial*>::const_iterator end)
{
    if ( nullptr == dest ) {
        return;
    }

    if (begin == end)   {
        *dest = NULL; // no materials ...
        return;
    }

    // Allocate the output material
    aiMaterial* out = *dest = new aiMaterial();

    // Get the maximal number of properties
    unsigned int size = 0;
    for (std::vector<aiMaterial*>::const_iterator it = begin; it != end; ++it) {
        size += (*it)->mNumProperties;
    }

    out->Clear();
    delete[] out->mProperties;

    out->mNumAllocated = size;
    out->mNumProperties = 0;
    out->mProperties = new aiMaterialProperty*[out->mNumAllocated];

    for (std::vector<aiMaterial*>::const_iterator it = begin; it != end; ++it) {
        for(unsigned int i = 0; i < (*it)->mNumProperties; ++i) {
            aiMaterialProperty* sprop = (*it)->mProperties[i];

            // Test if we already have a matching property
            const aiMaterialProperty* prop_exist;
            if(aiGetMaterialProperty(out, sprop->mKey.C_Str(), sprop->mSemantic, sprop->mIndex, &prop_exist) != AI_SUCCESS) {
                // If not, we add it to the new material
                aiMaterialProperty* prop = out->mProperties[out->mNumProperties] = new aiMaterialProperty();

                prop->mDataLength = sprop->mDataLength;
                prop->mData = new char[prop->mDataLength];
                ::memcpy(prop->mData, sprop->mData, prop->mDataLength);

                prop->mIndex    = sprop->mIndex;
                prop->mSemantic = sprop->mSemantic;
                prop->mKey      = sprop->mKey;
                prop->mType     = sprop->mType;

                out->mNumProperties++;
            }
        }
    }
}